

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::get_training_timesteps(search_private *priv,v_array<unsigned_long> *timesteps)

{
  float *pfVar1;
  pair<float,_unsigned_long> *ppVar2;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar3;
  ulong *puVar4;
  long lVar5;
  pair<COST_SENSITIVE::wclass_&,_bool> *ppVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong *puVar10;
  pair<COST_SENSITIVE::wclass_&,_bool> *ppVar11;
  ulong uVar12;
  uint uVar13;
  value_type_conflict1 __val;
  byte bVar14;
  uint uVar15;
  unsigned_long *__last;
  long lVar16;
  unsigned_long *puVar17;
  unsigned_long *__i;
  unsigned_long *__first;
  bool bVar18;
  float fVar19;
  size_t t;
  unsigned_long local_48;
  ulong *local_40;
  v_array<unsigned_long> *local_38;
  
  v_array<unsigned_long>::clear(timesteps);
  fVar19 = priv->subsample_timesteps;
  if (fVar19 <= -1.0) {
    if ((priv->active_uncertainty)._end != (priv->active_uncertainty)._begin) {
      lVar16 = 8;
      uVar8 = 0;
      do {
        fVar19 = merand48(&priv->all->random_state);
        ppVar2 = (priv->active_uncertainty)._begin;
        pfVar1 = (float *)((long)ppVar2 + lVar16 + -8);
        if (*pfVar1 <= fVar19 && fVar19 != *pfVar1) {
          local_48 = *(long *)((long)&ppVar2->first + lVar16) - 1;
          v_array<unsigned_long>::push_back(timesteps,&local_48);
        }
        uVar8 = uVar8 + 1;
        lVar16 = lVar16 + 0x10;
      } while (uVar8 < (ulong)((long)(priv->active_uncertainty)._end -
                               (long)(priv->active_uncertainty)._begin >> 4));
    }
  }
  else if (fVar19 <= 0.0) {
    local_48 = 0;
    if (priv->T != 0) {
      do {
        if ((priv->active_csoaa == true) &&
           (pvVar3 = (priv->active_known)._begin,
           local_48 < (ulong)((long)(priv->active_known)._end - (long)pvVar3 >> 5))) {
          if (pvVar3[local_48]._begin != pvVar3[local_48]._end) {
            uVar13 = 0;
            ppVar6 = pvVar3[local_48]._begin;
            do {
              ppVar11 = ppVar6 + 1;
              bVar14 = ppVar6->second & 1;
              uVar15 = uVar13 + 1;
              if (bVar14 != 0) {
                uVar13 = uVar15;
              }
            } while (((bVar14 & 1 < uVar15) == 0) &&
                    (ppVar6 = ppVar11, ppVar11 != pvVar3[local_48]._end));
            if (1 < uVar13) goto LAB_002579d5;
          }
        }
        else {
LAB_002579d5:
          v_array<unsigned_long>::push_back(timesteps,&local_48);
        }
        local_48 = local_48 + 1;
      } while (local_48 < priv->T);
    }
  }
  else if (1.0 <= fVar19) {
    __first = timesteps->_begin;
    __last = timesteps->_end;
    lVar16 = (long)__last - (long)__first;
    uVar8 = lVar16 >> 3;
    uVar12 = (ulong)priv->subsample_timesteps;
    if ((uVar8 < ((long)(priv->subsample_timesteps - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12))
       && (uVar8 < priv->T)) {
      do {
        fVar19 = merand48(&priv->all->random_state);
        fVar19 = fVar19 * (float)priv->T;
        local_48 = (unsigned_long)fVar19;
        local_48 = (long)(fVar19 - 9.223372e+18) & (long)local_48 >> 0x3f | local_48;
        puVar10 = timesteps->_begin;
        puVar4 = timesteps->_end;
        bVar18 = puVar10 != puVar4;
        if (bVar18) {
          uVar8 = *puVar10;
          while (uVar8 != local_48) {
            puVar10 = puVar10 + 1;
            bVar18 = puVar10 != puVar4;
            if (puVar10 == puVar4) break;
            uVar8 = *puVar10;
          }
        }
        if (!bVar18) {
          v_array<unsigned_long>::push_back(timesteps,&local_48);
        }
        __first = timesteps->_begin;
        __last = timesteps->_end;
        lVar16 = (long)__last - (long)__first;
        uVar8 = lVar16 >> 3;
        uVar12 = (ulong)priv->subsample_timesteps;
      } while ((uVar8 < ((long)(priv->subsample_timesteps - 9.223372e+18) & (long)uVar12 >> 0x3f |
                        uVar12)) && (uVar8 < priv->T));
    }
    if (__first != __last) {
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(unsigned_long,unsigned_long)>>
                (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(unsigned_long,_unsigned_long)>)0x25f20b);
      puVar10 = __first;
      if (lVar16 < 0x81) {
        while (puVar4 = puVar10 + 1, puVar4 != __last) {
          uVar8 = puVar10[1];
          if (uVar8 < *__first) {
            memmove((void *)((long)puVar10 + (0x10 - ((long)puVar4 - (long)__first))),__first,
                    (long)puVar4 - (long)__first);
            puVar10 = __first;
          }
          else {
            uVar12 = *puVar10;
            puVar10 = puVar4;
            while (uVar8 < uVar12) {
              *puVar10 = puVar10[-1];
              uVar12 = puVar10[-2];
              puVar10 = puVar10 + -1;
            }
          }
          *puVar10 = uVar8;
          puVar10 = puVar4;
        }
      }
      else {
        lVar16 = 8;
        puVar17 = __first;
        local_40 = __last;
        local_38 = timesteps;
        do {
          puVar10 = puVar10 + 1;
          puVar4 = (ulong *)((long)__first + lVar16);
          uVar8 = *(ulong *)((long)__first + lVar16);
          if (uVar8 < *__first) {
            memmove((void *)((long)puVar17 + (0x10 - ((long)puVar4 - (long)__first))),__first,
                    (long)puVar4 - (long)__first);
            puVar9 = __first;
          }
          else {
            uVar12 = *puVar17;
            puVar9 = puVar4;
            puVar7 = puVar10;
            while (uVar8 < uVar12) {
              puVar9 = puVar7 + -1;
              *puVar7 = puVar7[-1];
              uVar12 = puVar7[-2];
              puVar7 = puVar9;
            }
          }
          *puVar9 = uVar8;
          lVar16 = lVar16 + 8;
          puVar17 = puVar4;
        } while (lVar16 != 0x80);
        for (puVar10 = __first + 0x10; timesteps = local_38, puVar10 != local_40;
            puVar10 = puVar10 + 1) {
          uVar8 = *puVar10;
          uVar12 = puVar10[-1];
          puVar4 = puVar10;
          while (uVar8 < uVar12) {
            *puVar4 = puVar4[-1];
            uVar12 = puVar4[-2];
            puVar4 = puVar4 + -1;
          }
          *puVar4 = uVar8;
        }
      }
    }
  }
  else {
    local_48 = 0;
    if (priv->T != 0) {
      do {
        fVar19 = merand48(&priv->all->random_state);
        if (fVar19 <= priv->subsample_timesteps) {
          v_array<unsigned_long>::push_back(timesteps,&local_48);
        }
        local_48 = local_48 + 1;
      } while (local_48 < priv->T);
    }
    if (timesteps->_end == timesteps->_begin) {
      fVar19 = merand48(&priv->all->random_state);
      fVar19 = fVar19 * (float)priv->T;
      local_48 = (unsigned_long)fVar19;
      local_48 = (long)(fVar19 - 9.223372e+18) & (long)local_48 >> 0x3f | local_48;
      v_array<unsigned_long>::push_back(timesteps,&local_48);
    }
  }
  if (priv->linear_ordering == false) {
    hoopla_permute(timesteps->_begin,timesteps->_end);
  }
  return;
}

Assistant:

void get_training_timesteps(search_private& priv, v_array<size_t>& timesteps)
{
  timesteps.clear();

  // if there's active learning, we need to
  if (priv.subsample_timesteps <= -1)
  {
    for (size_t i = 0; i < priv.active_uncertainty.size(); i++)
      if (merand48(priv.all->random_state) > priv.active_uncertainty[i].first)
        timesteps.push_back(priv.active_uncertainty[i].second - 1);
    /*
    float k = (float)priv.total_examples_generated;
    priv.ec_seq[t]->revert_weight = priv.all->loss->getRevertingWeight(priv.all->sd, priv.ec_seq[t].pred.scalar,
    priv.all->eta / powf(k, priv.all->power_t)); float importance = query_decision(active_str, *priv.ec_seq[t], k); if
    (importance > 0.) timesteps.push_back(pair<size_t,size_t>(0,t));
    */
  }
  // if there's no subsampling to do, just return [0,T)
  else if (priv.subsample_timesteps <= 0)
    for (size_t t = 0; t < priv.T; t++)
    {
      uint32_t count = 99;
      if (priv.active_csoaa && (t < priv.active_known.size()))
      {
        count = 0;
        for (pair<CS::wclass&, bool> wcq : priv.active_known[t])
          if (wcq.second)
          {
            count++;
            if (count > 1)
              break;
          }
      }
      if (count > 1)
        timesteps.push_back(t);
    }

  // if subsample in (0,1) then pick steps with that probability, but ensuring there's at least one!
  else if (priv.subsample_timesteps < 1)
  {
    for (size_t t = 0; t < priv.T; t++)
      if (merand48(priv.all->random_state) <= priv.subsample_timesteps)
        timesteps.push_back(t);

    if (timesteps.size() == 0)  // ensure at least one
      timesteps.push_back((size_t)(merand48(priv.all->random_state) * priv.T));
  }

  // finally, if subsample >= 1, then pick (int) that many uniformly at random without replacement; could use an LFSR
  // but why? :P
  else
  {
    while ((timesteps.size() < (size_t)priv.subsample_timesteps) && (timesteps.size() < priv.T))
    {
      size_t t = (size_t)(merand48(priv.all->random_state) * (float)priv.T);
      if (!v_array_contains(timesteps, t))
        timesteps.push_back(t);
    }
    std::sort(timesteps.begin(), timesteps.end(), cmp_size_t);
  }

  if (!priv.linear_ordering)
    hoopla_permute(timesteps.begin(), timesteps.end());
}